

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::
int_writer<long_long,_fmt::v6::basic_format_specs<char>_>::on_num
          (int_writer<long_long,_fmt::v6::basic_format_specs<char>_> *this)

{
  long *plVar1;
  char cVar2;
  locale *plVar3;
  long lVar4;
  int iVar5;
  num_writer f;
  char cVar6;
  int iVar7;
  int iVar8;
  numpunct *pnVar9;
  long *plVar10;
  long *plVar11;
  uint uVar12;
  int iVar13;
  string_view prefix;
  string groups;
  locale local_60 [8];
  long *local_58;
  long local_50;
  long local_48 [2];
  ulong local_38;
  int iStack_30;
  undefined4 uStack_2c;
  long **local_28;
  char cStack_20;
  undefined7 uStack_1f;
  
  plVar3 = (locale *)(this->writer->locale_).locale_;
  if (plVar3 == (locale *)0x0) {
    std::locale::locale(local_60);
  }
  else {
    std::locale::locale(local_60,plVar3);
  }
  pnVar9 = std::use_facet<std::__cxx11::numpunct<char>>(local_60);
  (**(code **)(*(long *)pnVar9 + 0x20))(&local_58,pnVar9);
  std::locale::~locale(local_60);
  if (local_50 == 0) {
    on_dec(this);
  }
  else {
    plVar3 = (locale *)(this->writer->locale_).locale_;
    if (plVar3 == (locale *)0x0) {
      std::locale::locale(local_60);
    }
    else {
      std::locale::locale(local_60,plVar3);
    }
    pnVar9 = std::use_facet<std::__cxx11::numpunct<char>>(local_60);
    cVar6 = (**(code **)(*(long *)pnVar9 + 0x18))(pnVar9);
    std::locale::~locale(local_60);
    if (cVar6 == '\0') {
      on_dec(this);
    }
    else {
      local_38 = this->abs_value;
      lVar4 = 0x3f;
      if ((local_38 | 1) != 0) {
        for (; (local_38 | 1) >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      uVar12 = ((uint)lVar4 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
      iVar7 = uVar12 + (*(ulong *)(basic_data<void>::zero_or_powers_of_10_64 + (ulong)uVar12 * 8) <=
                       local_38);
      plVar1 = (long *)((long)local_58 + local_50);
      plVar11 = local_58;
      iVar8 = iVar7;
      iStack_30 = iVar7;
      if (local_50 != 0) {
        iVar5 = (int)local_50;
        plVar10 = local_58;
        do {
          cVar2 = (char)*plVar10;
          iVar13 = iVar8 - cVar2;
          plVar11 = plVar10;
          iStack_30 = iVar7;
          if ((iVar13 == 0 || iVar8 < cVar2) || ((byte)(cVar2 + 0x81U) < 0x82)) break;
          iVar7 = iVar7 + 1;
          plVar10 = (long *)((long)plVar10 + 1);
          local_50 = local_50 + -1;
          plVar11 = plVar1;
          iVar8 = iVar13;
          iStack_30 = iVar5 + uVar12 + (*(ulong *)(basic_data<void>::zero_or_powers_of_10_64 +
                                                  (ulong)uVar12 * 8) <= local_38);
        } while (local_50 != 0);
      }
      if (plVar11 == plVar1) {
        iStack_30 = iStack_30 + (iVar8 + -1) / (int)*(char *)((long)plVar1 + -1);
      }
      f._12_4_ = uStack_2c;
      f.size = iStack_30;
      f._25_7_ = uStack_1f;
      f.sep = cVar6;
      f.abs_value = local_38;
      f.groups = (string *)&local_58;
      prefix.size_._0_4_ = this->prefix_size;
      prefix.data_ = this->prefix;
      prefix.size_._4_4_ = 0;
      local_28 = &local_58;
      cStack_20 = cVar6;
      basic_writer<fmt::v6::buffer_range<char>>::
      write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<long_long,fmt::v6::basic_format_specs<char>>::num_writer>
                ((basic_writer<fmt::v6::buffer_range<char>> *)this->writer,iStack_30,prefix,
                 *this->specs,f);
    }
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return;
}

Assistant:

void on_num() {
      std::string groups = grouping<char_type>(writer.locale_);
      if (groups.empty()) return on_dec();
      auto sep = thousands_sep<char_type>(writer.locale_);
      if (!sep) return on_dec();
      int num_digits = count_digits(abs_value);
      int size = num_digits;
      std::string::const_iterator group = groups.cbegin();
      while (group != groups.cend() && num_digits > *group && *group > 0 &&
             *group != max_value<char>()) {
        size += sep_size;
        num_digits -= *group;
        ++group;
      }
      if (group == groups.cend())
        size += sep_size * ((num_digits - 1) / groups.back());
      writer.write_int(size, get_prefix(), specs,
                       num_writer{abs_value, size, groups, sep});
    }